

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_compileoption_get(int N)

{
  char **ppcVar1;
  int in_EDI;
  long in_FS_OFFSET;
  char **azCompileOpt;
  int nOpt;
  char *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = -0x55555556;
  ppcVar1 = sqlite3CompileOptions(&local_c);
  if ((in_EDI < 0) || (local_c <= in_EDI)) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = ppcVar1[in_EDI];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API const char *sqlite3_compileoption_get(int N){
  int nOpt;
  const char **azCompileOpt;
  azCompileOpt = sqlite3CompileOptions(&nOpt);
  if( N>=0 && N<nOpt ){
    return azCompileOpt[N];
  }
  return 0;
}